

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

void __thiscall OpenMD::MoleculeStamp::checkBends(MoleculeStamp *this)

{
  int iVar1;
  _Head_base<1UL,_int,_false> _Var2;
  _Head_base<1UL,_int,_false> _Var3;
  long lVar4;
  pointer piVar5;
  pointer ppAVar6;
  AtomStamp *pAVar7;
  pointer pcVar8;
  bool bVar9;
  _Head_base<2UL,_int,_false> _Var10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  long lVar13;
  _Alloc_hider _Var14;
  pointer ppBVar15;
  iterator iVar16;
  pointer ppBVar17;
  BendStamp *pBVar18;
  _Base_ptr p_Var19;
  ostream *poVar20;
  OpenMDException *pOVar21;
  int __tmp;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  long lVar22;
  ulong uVar23;
  _Base_ptr p_Var24;
  set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  allBends;
  size_t ghostIndex;
  vector<int,_std::allocator<int>_> bendAtoms;
  vector<int,_std::allocator<int>_> rigidSet;
  tuple<int,_int,_int> bendTuple;
  ostringstream oss;
  undefined1 local_248 [32];
  _Base_ptr local_228;
  size_t local_220;
  undefined1 local_218 [8];
  _Head_base<0UL,_int,_false> local_210;
  undefined4 uStack_20c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  string local_1f8;
  vector<int,_std::allocator<int>_> local_1d8;
  key_type local_1bc;
  ulong local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppBVar15 = (this->bendStamps_).
             super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->bendStamps_).
      super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar15) {
    lVar22 = 0;
    uVar23 = 0;
    do {
      lVar4 = *(long *)((long)ppBVar15 + (lVar22 >> 0x1d));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1f8,
                 (vector<int,_std::allocator<int>_> *)(lVar4 + 0x98));
      local_248._8_8_ =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var11 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                         (local_1f8._M_dataplus._M_p,local_1f8._M_string_length,local_248);
      local_248._0_8_ = (pointer)0x0;
      _Var12 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>>
                         (local_1f8._M_dataplus._M_p,local_1f8._M_string_length,local_248);
      if ((_Var11._M_current != (int *)local_1f8._M_string_length) ||
         (_Var12._M_current != (int *)local_1f8._M_string_length)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar8 = (this->Name).data_._M_dataplus._M_p;
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," : atoms of bend",0x10);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_218,(OpenMD *)&local_1f8,cont_00);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(char *)local_218,CONCAT44(uStack_20c,local_210._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," have invalid indices\n",0x16);
        if (local_218 != (undefined1  [8])&local_208) {
          operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
        }
        pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar21,(string *)local_248);
        __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      bVar9 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)&local_1f8);
      if (bVar9) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar8 = (this->Name).data_._M_dataplus._M_p;
        local_248._0_8_ = local_248 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," : atoms of bend",0x10);
        containerToString<std::vector<int,std::allocator<int>>>
                  ((string *)local_218,(OpenMD *)&local_1f8,cont_01);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,(char *)local_218,CONCAT44(uStack_20c,local_210._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar20," have duplicated indices\n",0x19);
        if (local_218 != (undefined1  [8])&local_208) {
          operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
        }
        pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar21,(string *)local_248);
        __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      lVar13 = (long)(local_1f8._M_string_length - (long)local_1f8._M_dataplus._M_p) >> 2;
      if (lVar13 == 3) {
        if (*(char *)(lVar4 + 0x92) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar8 = (this->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20,": normal bend should not have ghostVectorSouce\n",0x2f);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
          }
          pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar21,(string *)local_248);
          __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
      }
      else if (lVar13 == 2) {
        if (*(char *)(lVar4 + 0x92) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar8 = (this->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20,": ghostVectorSouce is missing\n",0x1e);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
          }
          pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar21,(string *)local_248);
          __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        local_218 = (undefined1  [8])(long)*(int *)(lVar4 + 0x94);
        if ((ulong)((long)(this->atomStamps_).
                          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->atomStamps_).
                          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)local_218) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar8 = (this->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,": ghostVectorSource ",0x14);
          poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"  is invalid\n",0xd);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
          }
          pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar21,(string *)local_248);
          __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                           (local_1f8._M_dataplus._M_p,local_1f8._M_string_length,local_218);
        if (_Var11._M_current == (int *)local_1f8._M_string_length) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar8 = (this->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,": ghostVectorSouce ",0x13);
          poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"is invalid\n",0xb);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
          }
          pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar21,(string *)local_248);
          __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        if ((this->atomStamps_).
            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start[(int)local_218._0_4_]->haveOrt_ == false) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Molecule ",0x12);
          pcVar8 = (this->Name).data_._M_dataplus._M_p;
          local_248._0_8_ = local_248 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar20,": ghost atom must be a directional atom\n",0x28);
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
          }
          pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar21,(string *)local_248);
          __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
      }
      if ((int *)local_1f8._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_1f8._M_dataplus._M_p,
                        local_1f8.field_2._M_allocated_capacity - (long)local_1f8._M_dataplus._M_p);
      }
      uVar23 = uVar23 + 1;
      ppBVar15 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x100000000;
    } while (uVar23 < (ulong)((long)(this->bendStamps_).
                                    super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar15 >> 3
                             ));
  }
  ppBVar15 = (this->bendStamps_).
             super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->bendStamps_).
      super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar15) {
    uVar23 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1f8,&ppBVar15[(int)uVar23]->members_);
      local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1d8,
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict1 *)local_248,(allocator_type *)local_218);
      if (local_1f8._M_dataplus._M_p != (pointer)local_1f8._M_string_length) {
        piVar5 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var14._M_p = local_1f8._M_dataplus._M_p;
        do {
          lVar22 = (long)piVar5[*(int *)_Var14._M_p];
          if ((-1 < lVar22) &&
             (iVar1 = local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar22],
             local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar22] = iVar1 + 1, 1 < iVar1)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Error in Molecule ",0x12);
            pcVar8 = (this->Name).data_._M_dataplus._M_p;
            local_248._0_8_ = local_248 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_248,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_248._0_8_,local_248._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,": bend",6);
            containerToString<std::vector<int,std::allocator<int>>>
                      ((string *)local_218,(OpenMD *)&local_1f8,cont);
            poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar20,(char *)local_218,
                                 CONCAT44(uStack_20c,local_210._M_head_impl));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar20,"has three atoms on the same rigid body\n",0x27);
            if (local_218 != (undefined1  [8])&local_208) {
              operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
              operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
            }
            pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar21,(string *)local_248);
            __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          _Var14._M_p = _Var14._M_p + 4;
        } while (_Var14._M_p != (pointer)local_1f8._M_string_length);
      }
      if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((int *)local_1f8._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_1f8._M_dataplus._M_p,
                        local_1f8.field_2._M_allocated_capacity - (long)local_1f8._M_dataplus._M_p);
      }
      uVar23 = uVar23 + 1;
      ppBVar15 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar23 < (ulong)((long)(this->bendStamps_).
                                    super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar15 >> 3
                             ));
  }
  local_248._24_8_ = local_248 + 8;
  local_248._8_8_ = local_248._8_8_ & 0xffffffff00000000;
  local_248._16_8_ = (_Base_ptr)0x0;
  local_220 = 0;
  ppBVar15 = (this->bendStamps_).
             super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_228 = (_Base_ptr)local_248._24_8_;
  if ((this->bendStamps_).
      super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar15) {
    lVar22 = 0;
    uVar23 = 0;
    do {
      lVar4 = *(long *)((long)ppBVar15 + (lVar22 >> 0x1d));
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1d8,(vector<int,_std::allocator<int>_> *)(lVar4 + 0x98));
      if ((long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == 8) {
        local_218._0_4_ = ((_Head_base<2UL,_int,_false> *)(lVar4 + 0x94))->_M_head_impl;
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish,local_218);
        if (_Var11._M_current !=
            local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          std::vector<int,_std::allocator<int>_>::insert
                    (&local_1d8,(const_iterator)_Var11._M_current,(value_type_conflict1 *)local_218)
          ;
        }
      }
      _Var10._M_head_impl =
           local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
      local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl =
           local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
      local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
           = *local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
      local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
      super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
           (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)_Var10._M_head_impl;
      if (_Var10._M_head_impl <
          local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
          _M_head_impl) {
        local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             (_Head_base<2UL,_int,_false>)
             (_Head_base<2UL,_int,_false>)
             local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
             _M_head_impl;
        local_1bc.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
        _M_head_impl = _Var10._M_head_impl;
      }
      iVar16 = std::
               _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
               ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       *)local_248,&local_1bc);
      if (iVar16._M_node != (_Base_ptr)(local_248 + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Molecule ",0x12);
        pcVar8 = (this->Name).data_._M_dataplus._M_p;
        local_218 = (undefined1  [8])&local_208;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_218,pcVar8,pcVar8 + (this->Name).data_._M_string_length);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_218,
                             CONCAT44(uStack_20c,local_210._M_head_impl));
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,"Bend",4);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_1f8,(OpenMD *)&local_1d8,cont_02);
        poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar20,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," appears multiple times\n",0x18)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if (local_218 != (undefined1  [8])&local_208) {
          operator_delete((void *)local_218,local_208._M_allocated_capacity + 1);
        }
        pOVar21 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar21,(string *)local_218);
        __cxa_throw(pOVar21,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
      ::_M_insert_unique<std::tuple<int,int,int>const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                  *)local_248,&local_1bc);
      if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar23 = uVar23 + 1;
      ppBVar15 = (this->bendStamps_).
                 super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x100000000;
    } while (uVar23 < (ulong)((long)(this->bendStamps_).
                                    super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar15 >> 3
                             ));
  }
  ppBVar17 = (this->bondStamps_).
             super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->bondStamps_).
      super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar17) {
    uVar23 = 0;
    do {
      _Var2._M_head_impl = ppBVar17[(int)uVar23]->a;
      ppAVar6 = (this->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pAVar7 = ppAVar6[_Var2._M_head_impl];
      p_Var19 = *(_Base_ptr *)((long)&(pAVar7->bondedAtoms_)._M_t._M_impl + 0x18);
      p_Var24 = (_Base_ptr)((long)&(pAVar7->bondedAtoms_)._M_t._M_impl + 8);
      if (p_Var19 == p_Var24) {
        _Var10._M_head_impl = ~_S_red;
      }
      else {
        _Var10._M_head_impl = p_Var19[1]._M_color;
      }
      _Var3._M_head_impl = ppBVar17[(int)uVar23]->b;
      pAVar7 = ppAVar6[_Var3._M_head_impl];
      local_1b0 = uVar23;
      while (_Var10._M_head_impl != ~_S_red) {
        if (_Var3._M_head_impl != _Var10._M_head_impl) {
          local_218._4_4_ = _Var2._M_head_impl;
          local_218._0_4_ = _Var3._M_head_impl;
          local_210._M_head_impl = _Var10._M_head_impl;
          iVar16 = std::
                   _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                           *)local_248,(key_type *)local_218);
          if (iVar16._M_node == (_Base_ptr)(local_248 + 8)) {
            std::
            _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
            ::_M_insert_unique<std::tuple<int,int,int>const&>
                      ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                        *)local_248,(tuple<int,_int,_int> *)local_218);
            pBVar18 = (BendStamp *)operator_new(0xf0);
            BendStamp::BendStamp(pBVar18);
            BendStamp::setMembers(pBVar18,(tuple<int,_int,_int> *)local_218);
            addBendStamp(this,pBVar18);
          }
        }
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
        if (p_Var19 == p_Var24) {
          _Var10._M_head_impl = ~_S_red;
        }
        else {
          _Var10._M_head_impl = p_Var19[1]._M_color;
        }
      }
      p_Var19 = *(_Base_ptr *)((long)&(pAVar7->bondedAtoms_)._M_t._M_impl + 0x18);
      p_Var24 = (_Base_ptr)((long)&(pAVar7->bondedAtoms_)._M_t._M_impl + 8);
      if (p_Var19 == p_Var24) {
        _Var10._M_head_impl = ~_S_red;
      }
      else {
        _Var10._M_head_impl = p_Var19[1]._M_color;
      }
      while (_Var10._M_head_impl != -1) {
        if (_Var2._M_head_impl != _Var10._M_head_impl) {
          local_218._4_4_ = _Var3._M_head_impl;
          local_218._0_4_ = _Var10._M_head_impl;
          local_210._M_head_impl = _Var2._M_head_impl;
          iVar16 = std::
                   _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                   ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                           *)local_248,(key_type *)local_218);
          if (iVar16._M_node == (_Base_ptr)(local_248 + 8)) {
            std::
            _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
            ::_M_insert_unique<std::tuple<int,int,int>const&>
                      ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                        *)local_248,(tuple<int,_int,_int> *)local_218);
            pBVar18 = (BendStamp *)operator_new(0xf0);
            BendStamp::BendStamp(pBVar18);
            BendStamp::setMembers(pBVar18,(tuple<int,_int,_int> *)local_218);
            addBendStamp(this,pBVar18);
          }
        }
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
        if (p_Var19 == p_Var24) {
          _Var10._M_head_impl = ~_S_red;
        }
        else {
          _Var10._M_head_impl = p_Var19[1]._M_color;
        }
      }
      uVar23 = local_1b0 + 1;
      ppBVar17 = (this->bondStamps_).
                 super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar23 < (ulong)((long)(this->bondStamps_).
                                    super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar17 >> 3
                             ));
  }
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
               *)local_248);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void MoleculeStamp::checkBends() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != bendAtoms.end() || k != bendAtoms.end()) {
        oss << "Error in Molecule " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(bendAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }

      if (bendAtoms.size() == 2) {
        if (!bendStamp->haveGhostVectorSource()) {
          oss << "Error in Molecule " << getName()
              << ": ghostVectorSouce is missing\n";
          throw OpenMDException(oss.str());
        } else {
          std::size_t ghostIndex = bendStamp->getGhostVectorSource();
          if (ghostIndex < getNAtoms()) {
            if (std::find(bendAtoms.begin(), bendAtoms.end(), ghostIndex) ==
                bendAtoms.end()) {
              oss << "Error in Molecule " << getName() << ": ghostVectorSouce "
                  << ghostIndex << "is invalid\n";
              throw OpenMDException(oss.str());
            }
            if (!getAtomStamp(ghostIndex)->haveOrientation()) {
              oss << "Error in Molecule " << getName()
                  << ": ghost atom must be a directional atom\n";
              throw OpenMDException(oss.str());
            }
          } else {
            oss << "Error in Molecule " << getName() << ": ghostVectorSource "
                << ghostIndex << "  is invalid\n";
            throw OpenMDException(oss.str());
          }
        }
      } else if (bendAtoms.size() == 3 && bendStamp->haveGhostVectorSource()) {
        oss << "Error in Molecule " << getName()
            << ": normal bend should not have ghostVectorSouce\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = bendAtoms.begin(); j != bendAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 2) {
            oss << "Error in Molecule " << getName() << ": bend"
                << containerToString(bendAtoms)
                << "has three atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int>> allBends;
    std::set<std::tuple<int, int, int>>::iterator iter;

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp  = getBendStamp(i);
      std::vector<int> bend = bendStamp->getMembers();
      if (bend.size() == 2) {
        // in case we have two ghost bend. For example,
        // bend {
        // members (0, 1);
        //   ghostVectorSource = 0;
        // }
        // and
        // bend {
        //   members (0, 1);
        // ghostVectorSource = 0;
        // }
        // In order to distinguish them. we expand them to Tuple3.
        // the first one is expanded to (0, 0, 1) while the second one
        // is expaned to (0, 1, 1)
        int ghostIndex = bendStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(bend.begin(), bend.end(), ghostIndex);
        if (j != bend.end()) { bend.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int> bendTuple {bend[0], bend[1], bend[2]};
      auto& [first, second, third] = bendTuple;

      // make sure the first element of bendTuple is always less than or equal
      // to the third element of bendTuple
      if (first > third) { std::swap(first, third); }

      iter = allBends.find(bendTuple);
      if (iter != allBends.end()) {
        oss << "Error in Molecule " << getName() << ": "
            << "Bend" << containerToString(bend) << " appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBends.insert(bendTuple);
      }
    }

    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int a                = bondStamp->getA();
      int b                = bondStamp->getB();

      AtomStamp* atomA = getAtomStamp(a);
      AtomStamp* atomB = getAtomStamp(b);

      // find bend c--a--b
      AtomStamp::AtomIter ai;
      for (int c = atomA->getFirstBondedAtom(ai); c != -1;
           c     = atomA->getNextBondedAtom(ai)) {
        if (b == c) continue;

        std::tuple<int, int, int> newBend {c, a, b};
        auto [first, second, third] = newBend;
        if (first > third) { std::swap(first, third); }

        if (allBends.find(newBend) == allBends.end()) {
          allBends.insert(newBend);
          BendStamp* newBendStamp = new BendStamp();
          newBendStamp->setMembers(newBend);
          addBendStamp(newBendStamp);
        }
      }

      // find bend a--b--c
      for (int c = atomB->getFirstBondedAtom(ai); c != -1;
           c     = atomB->getNextBondedAtom(ai)) {
        if (a == c) continue;

        std::tuple<int, int, int> newBend {a, b, c};
        auto [first, second, third] = newBend;
        if (first > third) { std::swap(first, third); }

        if (allBends.find(newBend) == allBends.end()) {
          allBends.insert(newBend);
          BendStamp* newBendStamp = new BendStamp();
          newBendStamp->setMembers(newBend);
          addBendStamp(newBendStamp);
        }
      }
    }
  }